

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  undefined1 auVar1 [16];
  SerialArenaChunk *pSVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar5;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessage *this_00;
  __pointer_type this_01;
  long lVar6;
  GetDeallocator deallocator_00;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar7;
  SizedPtr SVar8;
  SizedPtr mem;
  SerialArena *serial;
  GetDeallocator deallocator;
  LogMessage local_78;
  SerialArena *local_68;
  ThreadSafeArena *local_60;
  SerialArenaChunk *local_58;
  SerialArenaChunk *local_50;
  GetDeallocator local_48;
  LogMessage local_40;
  
  this_00 = &local_78;
  uVar5 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar5 == 0) {
    deallocator_00.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator_00.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar5 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  local_60 = this;
  local_48.dealloc_ = deallocator_00.dealloc_;
  do {
    bVar3 = SerialArenaChunk::IsSentry(this_01);
    if (bVar3) {
      SVar8 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                        (&local_60->first_arena_,deallocator_00);
      return SVar8;
    }
    local_58 = SerialArenaChunk::next_chunk(this_01);
    local_50 = this_01;
    SVar7 = SerialArenaChunk::arenas(this_01);
    for (lVar6 = SVar7.len_ << 3; pSVar2 = local_50, lVar6 != 0; lVar6 = lVar6 + -8) {
      local_68 = *(SerialArena **)((long)&SVar7.ptr_[-1]._M_b._M_p + lVar6);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_78.data_._M_t.
                     super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl;
      local_78 = (LogMessage)(auVar1 << 0x40);
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<google::protobuf::internal::SerialArena*,decltype(nullptr)>
                              (&local_68,(void **)&local_78,"serial != nullptr");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        line = 0x303;
LAB_00bdb8e6:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)this_00);
      }
      local_78 = (LogMessage)
                 SerialArena::
                 Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                           (local_68,deallocator_00);
      local_40.errno_saver_.saved_errno_ = 0;
      local_40._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                              ((void **)&local_78,(void **)&local_40,"mem.p != nullptr");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        this_00 = &local_40;
        line = 0x306;
        goto LAB_00bdb8e6;
      }
      anon_unknown_12::GetDeallocator::operator()(&local_48,(SizedPtr)local_78);
    }
    uVar4 = SerialArenaChunk::capacity(local_50);
    operator_delete(pSVar2,(ulong)uVar4 * 0x10 + 0x10);
    this_01 = local_58;
  } while( true );
}

Assistant:

inline size_t AllocationSize(size_t last_size, size_t start_size,
                             size_t max_size) {
  if (last_size == 0) return start_size;
  // Double the current block size, up to a limit.
  return std::min(2 * last_size, max_size);
}